

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>::
emplace_value<int*>(btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                    *this,size_type i,allocator_type *alloc,int **args)

{
  btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>> bVar1;
  ulong uVar2;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_> *c;
  ulong i_00;
  ulong i_01;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  uVar2 = (ulong)(byte)this[10];
  if (i <= uVar2) {
    for (; i < uVar2; uVar2 = uVar2 - 1) {
      *(undefined4 *)(this + uVar2 * 4 + 0xc) = *(undefined4 *)(this + uVar2 * 4 + 8);
    }
    *(int *)(this + i * 4 + 0xc) = **args;
    bVar1 = (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
             )((char)this[10] + 1);
    this[10] = bVar1;
    if (this[0xb] ==
        (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>)
        0x0) {
      i_00 = i + 1;
      uVar2 = (ulong)(byte)bVar1;
      if (i_00 < (byte)bVar1) {
        while ((int)i_00 < (int)uVar2) {
          i_01 = (ulong)((int)uVar2 - 1);
          c = btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::child((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                       *)this,i_01);
          btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::set_child((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                       *)this,uVar2,c);
          uVar2 = i_01;
        }
        btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
        ::mutable_child((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                         *)this,i_00);
        return;
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>, Args = <int *>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                             allocator_type *alloc,
                                             Args &&... args) {
        assert(i <= count());
        // Shift old values to create space for new value and then construct it in
        // place.
        if (i < count()) {
            value_init(count(), alloc, slot(count() - 1));
            for (size_type j = count() - 1; j > i; --j)
                params_type::move(alloc, slot(j - 1), slot(j));
            value_destroy(i, alloc);
        }
        value_init(i, alloc, std::forward<Args>(args)...);
        set_count((field_type)(count() + 1));

        if (!leaf() && count() > i + 1) {
            for (int j = count(); j > (int)(i + 1); --j) {
                set_child(j, child(j - 1));
            }
            clear_child(i + 1);
        }
    }